

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O3

string * __thiscall
gmath::(anonymous_namespace)::getCameraKey_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,char *key,int id)

{
  ostream *poVar1;
  size_t sVar2;
  string *psVar3;
  ostringstream os;
  undefined1 auStack_1a8 [15];
  char local_199;
  long local_198 [14];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"camera.",7);
  if (-1 < (int)key) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_198,(int)key);
    local_199 = '.';
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_199,1);
  }
  if (this == (_anonymous_namespace_ *)0x0) {
    std::ios::clear((int)auStack_1a8 + (int)*(undefined8 *)(local_198[0] + -0x18) + 0x10);
  }
  else {
    sVar2 = strlen((char *)this);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,(char *)this,sVar2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  psVar3 = (string *)std::ios_base::~ios_base(local_128);
  return psVar3;
}

Assistant:

std::string getCameraKey(const char *key, int id)
{
  std::ostringstream os;

  os << "camera.";

  if (id >= 0)
  {
    os << id << '.';
  }

  os << key;

  return os.str();
}